

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O2

MemoryFill * __thiscall MixedArena::alloc<wasm::MemoryFill>(MixedArena *this)

{
  MemoryFill *pMVar1;
  
  pMVar1 = (MemoryFill *)allocSpace(this,0x38,8);
  *(undefined8 *)&(pMVar1->super_SpecificExpression<(wasm::Expression::Id)39>).super_Expression = 0;
  (pMVar1->super_SpecificExpression<(wasm::Expression::Id)39>).super_Expression.type.id = 0;
  pMVar1->size = (Expression *)0x0;
  pMVar1->dest = (Expression *)0x0;
  pMVar1->value = (Expression *)0x0;
  (pMVar1->super_SpecificExpression<(wasm::Expression::Id)39>).super_Expression._id = MemoryFillId;
  (pMVar1->memory).super_IString.str._M_len = 0;
  (pMVar1->memory).super_IString.str._M_str = (char *)0x0;
  return pMVar1;
}

Assistant:

T* alloc() {
    static_assert(alignof(T) <= MAX_ALIGN,
                  "maximum alignment not large enough");
    auto* ret = static_cast<T*>(allocSpace(sizeof(T), alignof(T)));
    new (ret) T(*this); // allocated objects receive the allocator, so they can
                        // allocate more later if necessary
    return ret;
  }